

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O1

bool __thiscall cmDocumentation::PrintHelpOneVariable(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RCX;
  cmDocumentation *this_00;
  string_view str;
  string vname;
  undefined1 local_58 [32];
  string local_38;
  
  this_00 = (cmDocumentation *)local_58;
  str._M_str = in_RCX;
  str._M_len = (size_t)(this->CurrentArgument)._M_dataplus._M_p;
  cmSystemTools::HelpFileName_abi_cxx11_
            (&local_38,(cmSystemTools *)(this->CurrentArgument)._M_string_length,str);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 "variable/",&local_38);
  bVar1 = PrintFiles(this_00,os,(string *)local_58);
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Argument \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->CurrentArgument)._M_dataplus._M_p,
                        (this->CurrentArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"\" to --help-variable is not a defined variable.  ",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Use --help-variable-list to see all defined variables.\n",0x37);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneVariable(std::ostream& os)
{
  std::string vname = cmSystemTools::HelpFileName(this->CurrentArgument);
  if (this->PrintFiles(os, "variable/" + vname)) {
    return true;
  }
  // Argument was not a variable.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-variable is not a defined variable.  "
     << "Use --help-variable-list to see all defined variables.\n";
  return false;
}